

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockFormerVisitor.cpp
# Opt level: O2

void __thiscall
IRT::BlockFormerVisitor::Visit(BlockFormerVisitor *this,NameExpression *name_expression)

{
  NameExpression *this_00;
  Label LStack_38;
  
  this_00 = (NameExpression *)operator_new(0x28);
  std::__cxx11::string::string((string *)&LStack_38,(string *)&name_expression->label_);
  NameExpression::NameExpression(this_00,&LStack_38);
  (this->super_TemplateVisitor<IRT::IRTStorage>).tos_value_.expression_ = (Expression *)this_00;
  std::__cxx11::string::~string((string *)&LStack_38);
  return;
}

Assistant:

void BlockFormerVisitor::Visit(NameExpression* name_expression) {
  tos_value_.expression_ = new NameExpression(name_expression->label_);
}